

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::anon_unknown_15::reader_some::operator()(reader_some *this,error_code *e)

{
  atomic_counter *this_00;
  stream_socket *this_01;
  bool bVar1;
  size_t args_1;
  error_code err;
  event_handler local_30;
  error_code local_28;
  
  if (e->_M_value != 0) {
    callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,e,0);
    return;
  }
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  args_1 = stream_socket::read_some(this->sock,&this->buf,&local_28);
  if (((args_1 == 0) && (local_28._M_value != 0)) &&
     (bVar1 = basic_io_device::would_block(&local_28), bVar1)) {
    this_01 = this->sock;
    this_00 = &(this->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_;
    atomic_counter::inc(this_00);
    local_30.call_ptr.p_ = (pointer_type)(pointer_type)this;
    atomic_counter::inc(this_00);
    basic_io_device::on_readable((basic_io_device *)this_01,&local_30);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_30.call_ptr);
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some>::~intrusive_ptr
              ((intrusive_ptr<booster::aio::(anonymous_namespace)::reader_some> *)this);
    return;
  }
  callback<void_(const_std::error_code_&,_unsigned_long)>::operator()(&this->h,&local_28,args_1);
  return;
}

Assistant:

void operator()(system::error_code const &e) 
		{
			if(e) {
				h(e,0);
			}
			else {
				system::error_code err;
				size_t n=sock->read_some(buf,err);
				if(n==0 && err && basic_io_device::would_block(err))
					sock->on_readable(pointer(this));
				else
					h(err,n);
			}
		}